

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O3

void Io_NtkWriteNodeInt(FILE *pFile,Abc_Obj_t *pNode,Vec_Int_t *vCover)

{
  uint uVar1;
  char *pcVar2;
  word *pwVar3;
  word wVar4;
  int *piVar5;
  char *pcVar6;
  ushort uVar7;
  long lVar8;
  word *pwVar9;
  undefined8 extraout_RDX;
  undefined8 uVar10;
  uint nInputs;
  uint *puVar11;
  long lVar12;
  int *piVar13;
  undefined1 auVar14 [16];
  ulong uVar15;
  int nVarsMin [2];
  word Cofs6 [2];
  word uTruth7 [2];
  word Cofs7 [2] [2];
  int pVars [2] [10];
  int local_108 [2];
  long local_100;
  word local_f8 [3];
  char *local_e0;
  ulong local_d8;
  Vec_Int_t *local_d0;
  undefined1 local_c8 [16];
  word local_b8 [4];
  word local_98 [2];
  uint local_88 [10];
  uint local_60 [12];
  
  piVar13 = local_108;
  nInputs = (pNode->vFanins).nSize;
  local_d0 = vCover;
  if (7 < (int)nInputs) {
    pcVar2 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
    printf("Node \"%s\" has more than 7 inputs. Writing BLIF has failed.\n",pcVar2);
    return;
  }
  fputc(10,(FILE *)pFile);
  if ((int)nInputs < 5) {
    fwrite(".names",6,1,(FILE *)pFile);
    if (0 < (pNode->vFanins).nSize) {
      lVar12 = 0;
      do {
        pcVar2 = Abc_ObjName((Abc_Obj_t *)
                             pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar12]]);
        fprintf((FILE *)pFile," %s",pcVar2);
        lVar12 = lVar12 + 1;
      } while (lVar12 < (pNode->vFanins).nSize);
    }
    pcVar2 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
    fprintf((FILE *)pFile," %s\n",pcVar2);
    fputs((char *)(pNode->field_5).pData,(FILE *)pFile);
    return;
  }
  lVar12 = (long)(pNode->vFanins).nSize;
  if (0 < lVar12) {
    lVar8 = 0;
    do {
      local_60[lVar8] = (uint)lVar8;
      local_88[lVar8] = (uint)lVar8;
      lVar8 = lVar8 + 1;
    } while (lVar12 != lVar8);
  }
  if (nInputs == 7) {
    Abc_SopToTruth7((char *)(pNode->field_5).pData,7,local_b8);
    uVar1 = If_Dec7PickBestMux(local_b8,local_b8 + 2,local_98);
    if ((int)uVar1 < 0) {
      local_d8 = If_Dec7Perform(local_b8,1);
LAB_003210f9:
      if (local_d8 != 0) {
        local_e0 = (char *)(local_d8 >> 0x20);
        local_c8._8_4_ = (int)local_d8;
        local_c8._0_8_ = local_d8;
        local_c8._12_4_ = (int)(local_d8 >> 0x20);
        lVar12 = 1;
        puVar11 = local_60;
        do {
          auVar14._8_4_ = (int)lVar12;
          auVar14._0_8_ = lVar12;
          auVar14._12_4_ = (int)((ulong)lVar12 >> 0x20);
          uVar15 = auVar14._8_8_ << 5;
          uVar7 = (ushort)local_e0;
          if (lVar12 == 0) {
            uVar7 = (ushort)local_d8;
          }
          local_b8[lVar12] = (ulong)uVar7 * 0x1000100010001;
          local_88[lVar12 * 10] = (uint)((ulong)local_c8._0_8_ >> (lVar12 << 5 | 0x10U)) & 7;
          local_88[lVar12 * 10 + 1] = (uint)((ulong)local_c8._8_8_ >> (uVar15 | 0x14)) & 7;
          local_88[lVar12 * 10 + 2] = (uint)((ulong)local_c8._0_8_ >> (lVar12 << 5 | 0x18U)) & 7;
          local_88[lVar12 * 10 + 3] = (uint)((ulong)local_c8._8_8_ >> (uVar15 | 0x1c)) & 7;
          piVar13 = local_108 + lVar12;
          wVar4 = If_Dec6MinimumBase((ulong)uVar7 * 0x1000100010001,(int *)(local_88 + lVar12 * 10),
                                     4,piVar13);
          local_f8[lVar12] = wVar4;
          local_100 = lVar12;
          fwrite(".names",6,1,(FILE *)pFile);
          if (0 < *piVar13) {
            lVar12 = 0;
            do {
              if ((long)(int)puVar11[lVar12] == 7) {
                piVar5 = (pNode->vFanouts).pArray;
                pcVar2 = " %s_cascade";
              }
              else {
                piVar5 = (pNode->vFanins).pArray + (int)puVar11[lVar12];
                pcVar2 = " %s";
              }
              pcVar6 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*piVar5]);
              fprintf((FILE *)pFile,pcVar2,pcVar6);
              lVar12 = lVar12 + 1;
            } while (lVar12 < *piVar13);
          }
          pcVar2 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
          lVar8 = local_100;
          lVar12 = local_100 + -1;
          pcVar6 = "";
          if (local_100 == 0) {
            pcVar6 = "_cascade";
          }
          fprintf((FILE *)pFile," %s%s\n",pcVar2,pcVar6);
          pcVar2 = Io_NtkDeriveSop((Mem_Flex_t *)pNode->pNtk->pManFunc,local_f8[lVar8],
                                   local_108[lVar8],local_d0);
          fputs(pcVar2,(FILE *)pFile);
          puVar11 = puVar11 + -10;
        } while (lVar8 != 0);
        return;
      }
      pcVar2 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
      printf("Node \"%s\" is not decomposable. Writing BLIF has failed.\n",pcVar2);
      return;
    }
    If_Dec7MinimumBase(local_b8 + 2,(int *)local_88,7,local_108);
    If_Dec7MinimumBase(local_98,(int *)local_60,7,local_108 + 1);
  }
  else {
    wVar4 = Abc_SopToTruth((char *)(pNode->field_5).pData,nInputs);
    uVar1 = If_Dec6PickBestMux(wVar4,local_f8);
    if ((int)uVar1 < 0) {
      if ((nInputs & 0x7ffffffe) != 6) {
        __assert_fail("nVars == 6 || nVars == 7",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/io/ioWriteBlif.c"
                      ,0x390,"void Io_NtkWriteNodeInt(FILE *, Abc_Obj_t *, Vec_Int_t *)");
      }
      local_d8 = If_Dec6Perform(wVar4,1);
      goto LAB_003210f9;
    }
    local_f8[0] = If_Dec6MinimumBase(local_f8[0],(int *)local_88,nInputs,local_108);
    local_f8[1] = If_Dec6MinimumBase(local_f8[1],(int *)local_60,nInputs,local_108 + 1);
  }
  if (4 < local_108[0]) {
    __assert_fail("nVarsMin[0] < 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/io/ioWriteBlif.c"
                  ,0x37a,"void Io_NtkWriteNodeInt(FILE *, Abc_Obj_t *, Vec_Int_t *)");
  }
  if (local_108[1] < 5) {
    fwrite(".names",6,1,(FILE *)pFile);
    pcVar2 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[uVar1]]);
    fprintf((FILE *)pFile," %s",pcVar2);
    pcVar2 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
    fprintf((FILE *)pFile," %s_cascade0",pcVar2);
    pcVar2 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
    fprintf((FILE *)pFile," %s_cascade1",pcVar2);
    pcVar2 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
    fprintf((FILE *)pFile," %s\n",pcVar2);
    fwrite("1-1 1\n01- 1\n",0xc,1,(FILE *)pFile);
    pwVar9 = local_f8;
    pwVar3 = local_b8 + 2;
    uVar10 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
    local_100 = 0;
    local_c8._0_4_ = nInputs;
    do {
      local_d8 = CONCAT44(local_d8._4_4_,(int)uVar10);
      if (nInputs != 7) {
        pwVar3 = pwVar9;
      }
      local_e0 = Io_NtkDeriveSop((Mem_Flex_t *)pNode->pNtk->pManFunc,*pwVar3,*piVar13,local_d0);
      fwrite(".names",6,1,(FILE *)pFile);
      lVar12 = local_100;
      if (0 < *piVar13) {
        lVar8 = 0;
        do {
          pcVar2 = Abc_ObjName((Abc_Obj_t *)
                               pNode->pNtk->vObjs->pArray
                               [(pNode->vFanins).pArray[(int)local_88[lVar12 * 10 + lVar8]]]);
          fprintf((FILE *)pFile," %s",pcVar2);
          lVar8 = lVar8 + 1;
        } while (lVar8 < *piVar13);
      }
      pcVar2 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
      fprintf((FILE *)pFile," %s_cascade%d\n",pcVar2,local_100);
      fputs(local_e0,(FILE *)pFile);
      local_100 = 1;
      piVar13 = local_108 + 1;
      pwVar3 = local_98;
      pwVar9 = local_f8 + 1;
      uVar10 = 0;
      nInputs = local_c8._0_4_;
    } while ((local_d8 & 1) != 0);
    return;
  }
  __assert_fail("nVarsMin[1] < 5",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/io/ioWriteBlif.c"
                ,0x37b,"void Io_NtkWriteNodeInt(FILE *, Abc_Obj_t *, Vec_Int_t *)");
}

Assistant:

void Io_NtkWriteNodeInt( FILE * pFile, Abc_Obj_t * pNode, Vec_Int_t * vCover )
{
    Abc_Obj_t * pNet;
    int i, nVars = Abc_ObjFaninNum(pNode);
    if ( nVars > 7 )
    {
        printf( "Node \"%s\" has more than 7 inputs. Writing BLIF has failed.\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        return;
    }

    fprintf( pFile, "\n" );
    if ( nVars <= 4 )
    {
        // write the .names line
        fprintf( pFile, ".names" );
        Abc_ObjForEachFanin( pNode, pNet, i )
            fprintf( pFile, " %s", Abc_ObjName(pNet) );
        // get the output name
        fprintf( pFile, " %s\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        // write the cubes
        fprintf( pFile, "%s", (char*)Abc_ObjData(pNode) );
    }
    else
    {
        extern int  If_Dec6PickBestMux( word t, word Cofs[2] );
        extern int  If_Dec7PickBestMux( word t[2], word c0r[2], word c1r[2] );
        extern word If_Dec6MinimumBase( word uTruth, int * pSupp, int nVarsAll, int * pnVars );
        extern void If_Dec7MinimumBase( word uTruth[2], int * pSupp, int nVarsAll, int * pnVars );
        extern word If_Dec6Perform( word t, int fDerive );
        extern word If_Dec7Perform( word t[2], int fDerive );

        char * pSop;
        word z, uTruth6 = 0, uTruth7[2], Cofs6[2], Cofs7[2][2];
        int c, iVar, nVarsMin[2], pVars[2][10];

        // collect variables
        Abc_ObjForEachFanin( pNode, pNet, i )
            pVars[0][i] = pVars[1][i] = i;

        // derive truth table
        if ( nVars == 7 )
        {
            Abc_SopToTruth7( (char*)Abc_ObjData(pNode), nVars, uTruth7 );
            iVar = If_Dec7PickBestMux( uTruth7, Cofs7[0], Cofs7[1] );
        }
        else
        {
            uTruth6 = Abc_SopToTruth( (char*)Abc_ObjData(pNode), nVars );
            iVar = If_Dec6PickBestMux( uTruth6, Cofs6 );
        }

        // perform MUX decomposition
        if ( iVar >= 0 )
        {
            if ( nVars == 7 )
            {
                If_Dec7MinimumBase( Cofs7[0], pVars[0], nVars, &nVarsMin[0] );
                If_Dec7MinimumBase( Cofs7[1], pVars[1], nVars, &nVarsMin[1] );
            }
            else
            {
                Cofs6[0] = If_Dec6MinimumBase( Cofs6[0], pVars[0], nVars, &nVarsMin[0] );
                Cofs6[1] = If_Dec6MinimumBase( Cofs6[1], pVars[1], nVars, &nVarsMin[1] );
            }
            assert( nVarsMin[0] < 5 );
            assert( nVarsMin[1] < 5 );
            // write MUX
            fprintf( pFile, ".names" );
            fprintf( pFile, " %s", Abc_ObjName(Abc_ObjFanin(pNode,iVar)) );
            fprintf( pFile, " %s_cascade0", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            fprintf( pFile, " %s_cascade1", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            fprintf( pFile, " %s\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            fprintf( pFile, "1-1 1\n01- 1\n" );
            // write cofactors
            for ( c = 0; c < 2; c++ )
            {
                pSop = Io_NtkDeriveSop( (Mem_Flex_t *)Abc_ObjNtk(pNode)->pManFunc, 
                    (word)(nVars == 7 ? Cofs7[c][0] : Cofs6[c]), nVarsMin[c], vCover );
                fprintf( pFile, ".names" );
                for ( i = 0; i < nVarsMin[c]; i++ )
                    fprintf( pFile, " %s", Abc_ObjName(Abc_ObjFanin(pNode,pVars[c][i])) );
                fprintf( pFile, " %s_cascade%d\n", Abc_ObjName(Abc_ObjFanout0(pNode)), c );
                fprintf( pFile, "%s", pSop );
            }
            return;
        }
        assert( nVars == 6 || nVars == 7 );

        // try cascade decomposition
        if ( nVars == 7 )
        {
            z = If_Dec7Perform( uTruth7, 1 );
            //If_Dec7Verify( uTruth7, z );
        }
        else
        {
            z = If_Dec6Perform( uTruth6, 1 );
            //If_Dec6Verify( uTruth6, z );
        }
        if ( z == 0 )
        {
            printf( "Node \"%s\" is not decomposable. Writing BLIF has failed.\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            return;
        }

        // derive nodes
        for ( c = 1; c >= 0; c-- )
        {
            // collect fanins
            uTruth7[c]  = ((c ? z >> 32 : z) & 0xffff);
            uTruth7[c] |= (uTruth7[c] << 16);
            uTruth7[c] |= (uTruth7[c] << 32);
            for ( i = 0; i < 4; i++ )
                pVars[c][i] = (z >> (c*32+16+4*i)) & 7;

            // minimize truth table
            Cofs6[c] = If_Dec6MinimumBase( uTruth7[c], pVars[c], 4, &nVarsMin[c] );

            // write the nodes
            fprintf( pFile, ".names" );
            for ( i = 0; i < nVarsMin[c]; i++ )
                if ( pVars[c][i] == 7 )
                    fprintf( pFile, " %s_cascade", Abc_ObjName(Abc_ObjFanout0(pNode)) );
                else
                    fprintf( pFile, " %s", Abc_ObjName(Abc_ObjFanin(pNode,pVars[c][i])) );
            fprintf( pFile, " %s%s\n", Abc_ObjName(Abc_ObjFanout0(pNode)), c? "" : "_cascade" );

            // write SOP
            pSop = Io_NtkDeriveSop( (Mem_Flex_t *)Abc_ObjNtk(pNode)->pManFunc, 
                (word)Cofs6[c], nVarsMin[c], vCover );
            fprintf( pFile, "%s", pSop );
        }
    }
}